

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O3

void __thiscall wasm::DeNaN::visitFunction(DeNaN *this,Function *func)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  PassRunner *pPVar1;
  Module *wasm;
  string_view sVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  Type TVar7;
  Call *pCVar8;
  Block *pBVar9;
  long lVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar11;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  PassOptions *pPVar12;
  PassOptions *pPVar13;
  Index index;
  ulong uVar14;
  Expression **__args;
  byte bVar15;
  optional<wasm::Type> type;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  initializer_list<wasm::Expression_*> __l_01;
  PassOptions local_268;
  undefined1 local_1b0 [8];
  PassRunner runner;
  long local_b0 [2];
  char local_a0;
  string local_98;
  size_t local_78;
  DeNaN *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> fixes;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_48;
  __alloc_node_gen_t __alloc_node_gen;
  Builder builder;
  
  bVar15 = 0;
  if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    __alloc_node_gen._M_h =
         (__hashtable_alloc *)
         (this->
         super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
         ).super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
         super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.currModule;
    auStack_68 = (undefined1  [8])0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = this;
    local_78 = Function::getNumParams(func);
    uVar11 = extraout_RDX;
    if (local_78 != 0) {
      uVar14 = 0;
      do {
        index = (Index)uVar14;
        TVar7 = Function::getLocalType(func,index);
        if (TVar7.id == 4) {
          sVar2 = (local_70->deNan32).super_IString.str;
          fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)MixedArena::allocSpace((MixedArena *)(__alloc_node_gen._M_h + 0x200),0x18,8)
          ;
          *(undefined1 *)
           fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage = 8;
          *(Index *)(fixes.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = index;
          fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1] = (Expression *)0x4;
          __l._M_len = 1;
          __l._M_array = (iterator)
                         &fixes.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b0,
                     __l,(allocator_type *)((long)&builder.wasm + 7));
          pCVar8 = Builder::makeCall((Builder *)&__alloc_node_gen,(Name)sVar2,
                                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)local_1b0,(Type)0x4,false);
          local_48._M_h =
               (__hashtable_alloc *)
               Builder::makeLocalSet((Builder *)&__alloc_node_gen,index,(Expression *)pCVar8);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     (Expression **)&local_48);
          uVar11 = extraout_RDX_00;
LAB_00846f54:
          if (local_1b0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1b0,(long)runner.wasm - (long)local_1b0);
            uVar11 = extraout_RDX_04;
          }
        }
        else {
          TVar7 = Function::getLocalType(func,index);
          if (TVar7.id == 5) {
            sVar2 = (local_70->deNan64).super_IString.str;
            fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)MixedArena::allocSpace
                                    ((MixedArena *)(__alloc_node_gen._M_h + 0x200),0x18,8);
            *(undefined1 *)
             fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage = 8;
            *(Index *)(fixes.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = index;
            fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[1] = (Expression *)0x5;
            __l_00._M_len = 1;
            __l_00._M_array =
                 (iterator)
                 &fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b0,
                       __l_00,(allocator_type *)((long)&builder.wasm + 7));
            pCVar8 = Builder::makeCall((Builder *)&__alloc_node_gen,(Name)sVar2,
                                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        *)local_1b0,(Type)0x5,false);
            local_48._M_h =
                 (__hashtable_alloc *)
                 Builder::makeLocalSet((Builder *)&__alloc_node_gen,index,(Expression *)pCVar8);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                       (Expression **)&local_48);
            uVar11 = extraout_RDX_01;
            goto LAB_00846f54;
          }
          TVar7 = Function::getLocalType(func,index);
          uVar11 = extraout_RDX_02;
          if (TVar7.id == 6) {
            sVar2 = (local_70->deNan128).super_IString.str;
            fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)MixedArena::allocSpace
                                    ((MixedArena *)(__alloc_node_gen._M_h + 0x200),0x18,8);
            *(undefined1 *)
             fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage = 8;
            *(Index *)(fixes.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = index;
            fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[1] = (Expression *)0x6;
            __l_01._M_len = 1;
            __l_01._M_array =
                 (iterator)
                 &fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_1b0,
                       __l_01,(allocator_type *)((long)&builder.wasm + 7));
            pCVar8 = Builder::makeCall((Builder *)&__alloc_node_gen,(Name)sVar2,
                                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        *)local_1b0,(Type)0x6,false);
            local_48._M_h =
                 (__hashtable_alloc *)
                 Builder::makeLocalSet((Builder *)&__alloc_node_gen,index,(Expression *)pCVar8);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                       (Expression **)&local_48);
            uVar11 = extraout_RDX_03;
            goto LAB_00846f54;
          }
        }
        uVar14 = (ulong)(index + 1);
      } while (uVar14 < local_78);
    }
    if (auStack_68 !=
        (undefined1  [8])
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __args = &func->body;
      if (fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   (iterator)
                   fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,__args);
        uVar11 = extraout_RDX_05;
      }
      else {
        *fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
         super__Vector_impl_data._M_start = *__args;
        fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             fixes.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
      pBVar9 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         ((Builder *)&__alloc_node_gen,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_68,type);
      *__args = (Expression *)pBVar9;
      pPVar1 = (local_70->
               super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
               ).super_Pass.runner;
      wasm = (local_70->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
             ).
             super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
             .super_PostWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             super_Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>.
             currModule;
      pPVar12 = &pPVar1->options;
      pPVar13 = &local_268;
      for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -1) {
        bVar3 = pPVar12->validate;
        bVar4 = pPVar12->validateGlobally;
        uVar5 = pPVar12->field_0x3;
        iVar6 = pPVar12->optimizeLevel;
        pPVar13->debug = pPVar12->debug;
        pPVar13->validate = bVar3;
        pPVar13->validateGlobally = bVar4;
        pPVar13->field_0x3 = uVar5;
        pPVar13->optimizeLevel = iVar6;
        pPVar12 = (PassOptions *)((long)pPVar12 + (ulong)bVar15 * -0x10 + 8);
        pPVar13 = (PassOptions *)((long)pPVar13 + ((ulong)bVar15 * -2 + 1) * 8);
      }
      local_268.targetJS = (pPVar1->options).targetJS;
      this_00 = &local_268.arguments;
      local_268.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
      local_268.arguments._M_h._M_bucket_count = (pPVar1->options).arguments._M_h._M_bucket_count;
      local_268.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268.arguments._M_h._M_element_count = (pPVar1->options).arguments._M_h._M_element_count;
      local_268.arguments._M_h._M_rehash_policy._M_max_load_factor =
           (pPVar1->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
      local_268.arguments._M_h._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar1->options).arguments._M_h._M_rehash_policy.field_0x4;
      local_268.arguments._M_h._M_rehash_policy._M_next_resize =
           (pPVar1->options).arguments._M_h._M_rehash_policy._M_next_resize;
      local_268.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)this_00;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_00,&(pPVar1->options).arguments._M_h,&local_48);
      this_01 = &local_268.passesToSkip;
      local_268.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
      local_268.passesToSkip._M_h._M_bucket_count =
           (pPVar1->options).passesToSkip._M_h._M_bucket_count;
      local_268.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_268.passesToSkip._M_h._M_element_count =
           (pPVar1->options).passesToSkip._M_h._M_element_count;
      local_268.passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
           (pPVar1->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
      local_268.passesToSkip._M_h._M_rehash_policy._4_4_ =
           *(undefined4 *)&(pPVar1->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
      local_268.passesToSkip._M_h._M_rehash_policy._M_next_resize =
           (pPVar1->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
      local_268.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_48._M_h = (__hashtable_alloc *)this_01;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_01,&(pPVar1->options).passesToSkip._M_h,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                  *)&local_48);
      PassRunner::PassRunner((PassRunner *)local_1b0,wasm,&local_268);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&this_01->_M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&this_00->_M_h);
      runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"merge-blocks","");
      local_a0 = '\0';
      PassRunner::add((PassRunner *)local_1b0,&local_98,
                      (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&runner.isNested);
      if (local_a0 == '\x01') {
        local_a0 = '\0';
        if ((long *)runner._232_8_ != local_b0) {
          operator_delete((void *)runner._232_8_,local_b0[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      PassRunner::run((PassRunner *)local_1b0);
      PassRunner::~PassRunner((PassRunner *)local_1b0);
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)fixes.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    // Instrument all locals as they enter the function.
    Builder builder(*getModule());
    std::vector<Expression*> fixes;
    auto num = func->getNumParams();
    for (Index i = 0; i < num; i++) {
      if (func->getLocalType(i) == Type::f32) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan32, {builder.makeLocalGet(i, Type::f32)}, Type::f32)));
      } else if (func->getLocalType(i) == Type::f64) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan64, {builder.makeLocalGet(i, Type::f64)}, Type::f64)));
      } else if (func->getLocalType(i) == Type::v128) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan128, {builder.makeLocalGet(i, Type::v128)}, Type::v128)));
      }
    }
    if (!fixes.empty()) {
      fixes.push_back(func->body);
      func->body = builder.makeBlock(fixes);
      // Merge blocks so we don't add an unnecessary one.
      PassRunner runner(getModule(), getPassOptions());
      runner.setIsNested(true);
      runner.add("merge-blocks");
      runner.run();
    }
  }